

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O3

int __thiscall
OSSLEDDSA::verify(OSSLEDDSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  char cVar1;
  int iVar2;
  EVP_PKEY *pkey;
  long lVar3;
  size_t sVar4;
  EVP_MD_CTX *ctx_00;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  undefined8 unaff_RBP;
  char *format;
  
  if ((int)tbs == 0x1a) {
    cVar1 = (**(code **)(*(long *)ctx + 0x18))(ctx);
    if (cVar1 == '\0') {
      format = "Invalid key type supplied";
      iVar2 = 0x8c;
    }
    else {
      pkey = (EVP_PKEY *)OSSLEDPublicKey::getOSSLKey((OSSLEDPublicKey *)ctx);
      if (pkey == (EVP_PKEY *)0x0) {
        format = "Could not get the OpenSSL public key";
        iVar2 = 0x96;
      }
      else {
        lVar3 = (**(code **)(*(long *)ctx + 0x30))(ctx);
        if (lVar3 == 0) {
          format = "Could not get the order length";
          iVar2 = 0x9f;
        }
        else {
          sVar4 = ByteString::size((ByteString *)siglen);
          if (sVar4 == lVar3 * 2) {
            ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
            iVar2 = EVP_DigestVerifyInit
                              (ctx_00,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,pkey);
            if (iVar2 == 0) {
              uVar7 = ERR_get_error();
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                         ,0xab,"EDDSA verify init failed (0x%08X)",uVar7);
              EVP_MD_CTX_free(ctx_00);
              return 0;
            }
            puVar5 = ByteString::const_byte_str((ByteString *)siglen);
            puVar6 = ByteString::const_byte_str((ByteString *)sig);
            sVar4 = ByteString::size((ByteString *)sig);
            iVar2 = EVP_DigestVerify(ctx_00,puVar5,lVar3 * 2,puVar6,sVar4);
            if (iVar2 == 1) {
              EVP_MD_CTX_free(ctx_00);
              return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
            }
            if (iVar2 < 0) {
              uVar7 = ERR_get_error();
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                         ,0xb3,"EDDSA verify failed (0x%08X)",uVar7);
            }
            EVP_MD_CTX_free(ctx_00);
            return 0;
          }
          format = "Invalid buffer length";
          iVar2 = 0xa5;
        }
      }
    }
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,iVar2,format);
  }
  else {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,0x85,"Invalid mechanism supplied (%i)",(ulong)tbs & 0xffffffff);
  }
  return 0;
}

Assistant:

bool OSSLEDDSA::verify(PublicKey* publicKey, const ByteString& originalData,
		       const ByteString& signature, const AsymMech::Type mechanism,
		       const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::EDDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!publicKey->isOfType(OSSLEDPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLEDPublicKey* pk = (OSSLEDPublicKey*) publicKey;
	EVP_PKEY* pkey = pk->getOSSLKey();

	if (pkey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL public key");

		return false;
	}

	// Perform the verify operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	len *= 2;
	if (signature.size() != len)
	{
		ERROR_MSG("Invalid buffer length");
		return false;
	}
	EVP_MD_CTX* ctx = EVP_MD_CTX_new();
	if (!EVP_DigestVerifyInit(ctx, NULL, NULL, NULL, pkey))
	{
		ERROR_MSG("EDDSA verify init failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	int ret = EVP_DigestVerify(ctx, signature.const_byte_str(), len, originalData.const_byte_str(), originalData.size());
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("EDDSA verify failed (0x%08X)", ERR_get_error());
		EVP_MD_CTX_free(ctx);
		return false;
	}
	EVP_MD_CTX_free(ctx);
	return true;
}